

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_file(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  void *pvVar2;
  ushort **ppuVar3;
  bool bVar4;
  jx9_value *local_a8;
  int local_80;
  uint local_7c;
  int nLen;
  int iFlags;
  jx9_int64 n;
  io_private *pDev;
  jx9_io_stream *pjStack_60;
  int use_include;
  jx9_io_stream *pStream;
  jx9_value *pLine;
  jx9_value *pArray;
  char *zBuf;
  char *zEnd;
  char *zPtr;
  char *zFile;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pDev._4_4_ = 0;
  zFile = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pjStack_18,2,"Expecting a file path");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    zPtr = jx9_value_to_string(*(jx9_value **)zFile,&local_80);
    pjStack_60 = jx9VmGetStreamDevice(pjStack_18->pVm,&zPtr,local_80);
    if (pjStack_60 == (jx9_io_stream *)0x0) {
      jx9_context_throw_error(pjStack_18,2,"No such stream device, JX9 is returning FALSE");
      jx9_result_bool(pjStack_18,0);
    }
    else {
      n = (jx9_int64)jx9_context_alloc_chunk(pjStack_18,0x38,1,0);
      if ((io_private *)n == (io_private *)0x0) {
        jx9_context_throw_error(pjStack_18,1,"JX9 is running out of memory");
        jx9_result_bool(pjStack_18,0);
      }
      else {
        InitIOPrivate(pjStack_18->pVm,pjStack_60,(io_private *)n);
        local_7c = 0;
        if (1 < apArg_local._4_4_) {
          local_7c = jx9_value_to_int(*(jx9_value **)(zFile + 8));
        }
        if ((local_7c & 1) != 0) {
          pDev._4_4_ = 1;
        }
        pLine = jx9_context_new_array(pjStack_18);
        pStream = (jx9_io_stream *)jx9_context_new_scalar(pjStack_18);
        if ((pLine == (jx9_value *)0x0) || (pStream == (jx9_io_stream *)0x0)) {
          jx9_context_throw_error(pjStack_18,1,"JX9 is running out of memory");
          jx9_result_bool(pjStack_18,0);
        }
        else {
          if (apArg_local._4_4_ < 3) {
            local_a8 = (jx9_value *)0x0;
          }
          else {
            local_a8 = *(jx9_value **)(zFile + 0x10);
          }
          pvVar2 = jx9StreamOpenHandle(pjStack_18->pVm,pjStack_60,zPtr,1,pDev._4_4_,local_a8,0,
                                       (int *)0x0);
          *(void **)(n + 8) = pvVar2;
          if (*(long *)(n + 8) == 0) {
            jx9_context_throw_error_format(pjStack_18,1,"IO error while opening \'%s\'",zPtr);
            jx9_result_bool(pjStack_18,0);
          }
          else {
LAB_0015d5e8:
            _nLen = StreamReadLine((io_private *)n,(char **)&pArray,-1);
            if (0 < _nLen) {
              jx9_value_reset_string_cursor((jx9_value *)pStream);
              zEnd = (char *)pArray;
              zBuf = (char *)((long)&pArray->x + _nLen);
              if ((local_7c & 2) != 0) {
                while( true ) {
                  bVar4 = false;
                  if (pArray < zBuf) {
                    bVar4 = zBuf[-1] == '\n';
                  }
                  if (!bVar4) break;
                  _nLen = _nLen + -1;
                  zBuf = zBuf + -1;
                }
              }
              if ((local_7c & 4) != 0) goto LAB_0015d691;
              goto LAB_0015d70c;
            }
            jx9StreamCloseHandle(pjStack_60,*(void **)(n + 8));
            ReleaseIOPrivate(pjStack_18,(io_private *)n);
            jx9_result_value(pjStack_18,pLine);
          }
        }
      }
    }
  }
  return 0;
LAB_0015d691:
  while( true ) {
    bVar4 = false;
    if ((zEnd < zBuf) && (bVar4 = false, (byte)*zEnd < 0xc0)) {
      ppuVar3 = __ctype_b_loc();
      bVar4 = ((*ppuVar3)[(int)*zEnd] & 0x2000) != 0;
    }
    if (!bVar4) break;
    zEnd = zEnd + 1;
  }
  if (zEnd < zBuf) {
LAB_0015d70c:
    jx9_value_string((jx9_value *)pStream,(char *)pArray,(int)zBuf - (int)pArray);
    jx9_array_add_elem(pLine,(jx9_value *)0x0,(jx9_value *)pStream);
  }
  goto LAB_0015d5e8;
}

Assistant:

static int jx9Builtin_file(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFile, *zPtr, *zEnd, *zBuf;
	jx9_value *pArray, *pLine;
	const jx9_io_stream *pStream;
	int use_include = 0;
	io_private *pDev;
	jx9_int64 n;
	int iFlags;
	int nLen;
	
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Allocate a new IO private instance */
	pDev = (io_private *)jx9_context_alloc_chunk(pCtx, sizeof(io_private), TRUE, FALSE);
	if( pDev == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Initialize the structure */
	InitIOPrivate(pCtx->pVm, pStream, pDev);
	iFlags = 0;
	if( nArg > 1 ){
		iFlags = jx9_value_to_int(apArg[1]);
	}
	if( iFlags & 0x01 /*FILE_USE_INCLUDE_PATH*/ ){
		use_include = TRUE;
	}
	/* Create the array and the working value */
	pArray = jx9_context_new_array(pCtx);
	pLine = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pLine == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Try to open the file in read-only mode */
	pDev->pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, use_include, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pDev->pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		/* Don't worry about freeing memory, everything will be released automatically
		 * as soon we return from this function.
		 */
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		/* Try to extract a line */
		n = StreamReadLine(pDev, &zBuf, -1);
		if( n < 1 ){
			/* EOF or IO error */
			break;
		}
		/* Reset the cursor */
		jx9_value_reset_string_cursor(pLine);
		/* Remove line ending if requested by the caller */
		zPtr = zBuf;
		zEnd = &zBuf[n];
		if( iFlags & 0x02 /* FILE_IGNORE_NEW_LINES */ ){
			/* Ignore trailig lines */
			while( zPtr < zEnd && (zEnd[-1] == '\n' 
#ifdef __WINNT__
				|| zEnd[-1] == '\r'
#endif
				)){
					n--;
					zEnd--;
			}
		}
		if( iFlags & 0x04 /* FILE_SKIP_EMPTY_LINES */ ){
			/* Ignore empty lines */
			while( zPtr < zEnd && (unsigned char)zPtr[0] < 0xc0 && SyisSpace(zPtr[0]) ){
				zPtr++;
			}
			if( zPtr >= zEnd ){
				/* Empty line */
				continue;
			}
		}
		jx9_value_string(pLine, zBuf, (int)(zEnd-zBuf));
		/* Insert line */
		jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pLine);
	}
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pDev->pHandle);
	/* Release the io_private instance */
	ReleaseIOPrivate(pCtx, pDev);
	/* Return the created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}